

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_libgcc-inl.h
# Opt level: O1

int GetStackTraceWithContext_libgcc(void **result,int max_depth,int skip_count,void *ucp)

{
  void **local_28;
  libgcc_backtrace_data data;
  
  data.array._0_4_ = skip_count + 2;
  data.array._4_4_ = 0;
  local_28 = result;
  data.skip = max_depth;
  _Unwind_Backtrace(libgcc_backtrace_helper,&local_28);
  if ((1 < (long)data.array._4_4_) && (local_28[(long)data.array._4_4_ + -1] == (void *)0x0)) {
    data.array._4_4_ = data.array._4_4_ + -1;
  }
  return data.array._4_4_;
}

Assistant:

static int GET_STACK_TRACE_OR_FRAMES {
  libgcc_backtrace_data data;
  data.array = result;
  // we're also skipping current and parent's frame
  data.skip = skip_count + 2;
  data.pos = 0;
  data.limit = max_depth;

  _Unwind_Backtrace(libgcc_backtrace_helper, &data);

  if (data.pos > 1 && data.array[data.pos - 1] == nullptr)
    --data.pos;

#if IS_STACK_FRAMES
  // No implementation for finding out the stack frame sizes.
  memset(sizes, 0, sizeof(*sizes) * data.pos);
#endif

  return data.pos;
}